

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O0

void __thiscall Qentem::QExpression::operator&=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  QExpression *right_local;
  QExpression *this_local;
  
  EVar1 = this->Type;
  if (EVar1 == RealNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)((long)*(double *)&this->field_0 & (long)*(double *)&right->field_0);
      this->Type = IntegerNumber;
    }
    else if (EVar1 == NaturalNumber || EVar1 == IntegerNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)*(double *)&this->field_0 & (ulong)(right->field_0).SubExpressions.storage_);
      this->Type = IntegerNumber;
    }
  }
  else if (EVar1 == NaturalNumber) {
    EVar1 = right->Type;
    if (EVar1 == RealNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)*(double *)&right->field_0 & (ulong)(this->field_0).SubExpressions.storage_);
      this->Type = IntegerNumber;
    }
    else if (EVar1 == NaturalNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((ulong)(right->field_0).SubExpressions.storage_ &
           (ulong)(this->field_0).SubExpressions.storage_);
    }
    else if (EVar1 == IntegerNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((ulong)(right->field_0).SubExpressions.storage_ &
           (ulong)(this->field_0).SubExpressions.storage_);
      this->Type = IntegerNumber;
    }
  }
  else if (EVar1 == IntegerNumber) {
    if (right->Type == RealNumber) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)*(double *)&right->field_0 & (ulong)(this->field_0).SubExpressions.storage_);
      this->Type = IntegerNumber;
    }
    else {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((ulong)(right->field_0).SubExpressions.storage_ &
           (ulong)(this->field_0).SubExpressions.storage_);
    }
  }
  return;
}

Assistant:

void operator&=(const QExpression &right) noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        Value.Number.Natural &= right.Value.Number.Natural;
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer &= right.Value.Number.Integer;
                        Type = ExpressionType::IntegerNumber;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Integer &= SizeT64I(right.Value.Number.Real);
                        Type = ExpressionType::IntegerNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::IntegerNumber: {
                if (right.Type == ExpressionType::RealNumber) {
                    Value.Number.Integer &= SizeT64I(right.Value.Number.Real);
                    Type = ExpressionType::IntegerNumber;
                } else {
                    Value.Number.Integer &= right.Value.Number.Integer;
                }

                break;
            }

            case ExpressionType::RealNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber:
                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer = SizeT64I(Value.Number.Real) & right.Value.Number.Integer;
                        Type                 = ExpressionType::IntegerNumber;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Integer = SizeT64I(Value.Number.Real) & SizeT64I(right.Value.Number.Real);
                        Type                 = ExpressionType::IntegerNumber;
                    }

                    default: {
                    }
                }
            }

            default: {
            }
        }
    }